

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O2

Type * __thiscall
slang::ast::builtins::SdfAnnotateTask::checkArguments
          (SdfAnnotateTask *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Compilation *pCVar1;
  bool bVar2;
  Type *pTVar3;
  ulong uVar4;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount((SystemSubroutine *)this,context,false,args,range,1,7);
  if (bVar2) {
    for (uVar4 = 0; uVar4 < (args->_M_extent)._M_extent_value; uVar4 = uVar4 + 1) {
      if (uVar4 != 1) {
        bVar2 = Type::canBeStringLike(((*args->_M_ptr)->type).ptr);
        if (!bVar2) {
          pTVar3 = SystemSubroutine::badArg((SystemSubroutine *)this,context,args->_M_ptr[uVar4]);
          return pTVar3;
        }
      }
    }
    pTVar3 = pCVar1->voidType;
  }
  else {
    pTVar3 = pCVar1->errorType;
  }
  return pTVar3;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 1, 7))
            return comp.getErrorType();

        for (size_t i = 0; i < args.size(); i++) {
            if (i != 1 && !args[0]->type->canBeStringLike())
                return badArg(context, *args[i]);
        }

        return comp.getVoidType();
    }